

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ssize_t __thiscall kj::InputStream::read(InputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  ArrayPtr<unsigned_char> local_a0;
  ArrayPtr<unsigned_char> local_90;
  Fault local_80;
  Fault f;
  undefined1 local_70 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  size_t local_38;
  size_t n;
  size_t minBytes_local;
  InputStream *this_local;
  ArrayPtr<unsigned_char> buffer_local;
  
  _kjCondition._32_8_ = CONCAT44(in_register_00000034,__fd);
  n = __nbytes;
  minBytes_local = (size_t)this;
  this_local = (InputStream *)_kjCondition._32_8_;
  buffer_local.ptr = (uchar *)__buf;
  iVar2 = (*this->_vptr_InputStream[2])(this,_kjCondition._32_8_,__buf);
  local_38 = CONCAT44(extraout_var,iVar2);
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_38);
  kj::_::DebugExpression<unsigned_long&>::operator>=
            ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_70,
             (DebugExpression<unsigned_long&> *)&f,&n);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_70);
  if (bVar1) {
    buffer_local.size_ = local_38;
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[14]>
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
               ,0x35,FAILED,"n >= minBytes","_kjCondition,\"Premature EOF\"",
               (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_70,
               (char (*) [14])"Premature EOF");
    local_a0 = ArrayPtr<unsigned_char>::slice((ArrayPtr<unsigned_char> *)&this_local,local_38);
    local_90 = ArrayPtr<unsigned_char>::first(&local_a0,n - local_38);
    ArrayPtr<unsigned_char>::fill(&local_90,'\0');
    buffer_local.size_ = n;
    kj::_::Debug::Fault::~Fault(&local_80);
  }
  return buffer_local.size_;
}

Assistant:

size_t InputStream::read(ArrayPtr<byte> buffer, size_t minBytes) {
  size_t n = tryRead(buffer, minBytes);
  KJ_REQUIRE(n >= minBytes, "Premature EOF") {
    // Pretend we read zeros from the input.
    buffer.slice(n).first(minBytes-n).fill(0);
    return minBytes;
  }
  return n;
}